

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

void warn(QPDF *qpdf,QPDFObjectHandle *node,string *msg)

{
  string sStack_38;
  
  get_description_abi_cxx11_(&sStack_38,node);
  QPDF::warn(qpdf,qpdf_e_damaged_pdf,&sStack_38,0,msg);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

static void
warn(QPDF& qpdf, QPDFObjectHandle& node, std::string const& msg)
{
    qpdf.warn(qpdf_e_damaged_pdf, get_description(node), 0, msg);
}